

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O3

void secp256k1_sha256_write(secp256k1_sha256 *hash,uchar *data,size_t len)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long extraout_RDX;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  secp256k1_sha256 *hash_00;
  secp256k1_scalar *psVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  size_t __n;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uStack_1d0;
  uint uStack_1cc;
  uchar uStack_198;
  undefined1 uStack_197;
  undefined1 uStack_196;
  undefined1 uStack_195;
  undefined1 uStack_194;
  undefined1 uStack_193;
  undefined1 uStack_192;
  char cStack_191;
  ulong local_a8;
  
  hash_00 = (secp256k1_sha256 *)hash->bytes;
  hash->bytes = (long)hash_00->s + len;
  if (!CARRY8((ulong)hash_00,len)) {
    uVar38 = (ulong)((uint)hash_00 & 0x3f);
    __n = 0x40 - uVar38;
    local_a8 = uVar38;
    if (__n <= len) {
      local_a8 = 0;
      do {
        memcpy(hash->buf + uVar38,data,__n);
        data = data + __n;
        len = len - __n;
        uVar16 = hash->s[0];
        uVar21 = hash->s[1];
        uVar1 = hash->s[2];
        uVar2 = hash->s[3];
        uVar3 = hash->s[4];
        uVar4 = hash->s[5];
        uVar5 = hash->s[6];
        uVar6 = hash->s[7];
        uVar10 = *(uint *)hash->buf;
        uVar50 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
        ;
        iVar12 = ((uVar5 ^ uVar4) & uVar3 ^ uVar5) + uVar6 +
                 ((uVar3 << 7 | uVar3 >> 0x19) ^
                 (uVar3 << 0x15 | uVar3 >> 0xb) ^ (uVar3 << 0x1a | uVar3 >> 6));
        uVar9 = ((uVar21 | uVar16) & uVar1 | uVar21 & uVar16) +
                ((uVar16 << 10 | uVar16 >> 0x16) ^
                (uVar16 << 0x13 | uVar16 >> 0xd) ^ (uVar16 << 0x1e | uVar16 >> 2)) +
                uVar50 + iVar12 + 0x428a2f98;
        uVar51 = uVar2 + iVar12 + uVar50 + 0x428a2f98;
        uVar10 = *(uint *)(hash->buf + 4);
        uVar25 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8;
        uVar17 = uVar25 | uVar10 << 0x18;
        iVar12 = ((uVar4 ^ uVar3) & uVar51 ^ uVar4) + uVar17 + uVar5;
        uVar18 = (uVar51 * 0x80 | uVar51 >> 0x19) ^
                 (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6);
        uVar19 = uVar1 + iVar12 + uVar18 + 0x71374491;
        uVar27 = ((uVar9 | uVar16) & uVar21 | uVar9 & uVar16) +
                 ((uVar9 * 0x400 | uVar9 >> 0x16) ^
                 (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) +
                 iVar12 + uVar18 + 0x71374491;
        uVar13 = (uVar19 * 0x80 | uVar19 >> 0x19) ^
                 (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6);
        uVar18 = *(uint *)(hash->buf + 8);
        uVar26 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8;
        uVar40 = uVar26 | uVar18 << 0x18;
        iVar12 = ((uVar51 ^ uVar3) & uVar19 ^ uVar3) + uVar40 + uVar4;
        uVar35 = ((uVar27 | uVar9) & uVar16 | uVar27 & uVar9) +
                 ((uVar27 * 0x400 | uVar27 >> 0x16) ^
                 (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) +
                 uVar13 + iVar12 + -0x4a3f0431;
        uVar14 = uVar21 + iVar12 + uVar13 + 0xb5c0fbcf;
        uVar41 = (uVar14 * 0x80 | uVar14 >> 0x19) ^
                 (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6);
        uVar13 = *(uint *)(hash->buf + 0xc);
        uVar37 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8;
        uVar56 = uVar37 | uVar13 << 0x18;
        iVar12 = ((uVar19 ^ uVar51) & uVar14 ^ uVar51) + uVar3 + uVar56;
        uVar46 = ((uVar35 | uVar27) & uVar9 | uVar35 & uVar27) +
                 ((uVar35 * 0x400 | uVar35 >> 0x16) ^
                 (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) +
                 uVar41 + iVar12 + -0x164a245b;
        uVar42 = uVar16 + iVar12 + uVar41 + 0xe9b5dba5;
        uVar41 = *(uint *)(hash->buf + 0x10);
        uVar55 = uVar41 >> 0x18 | (uVar41 & 0xff0000) >> 8 | (uVar41 & 0xff00) << 8;
        uVar22 = uVar55 | uVar41 << 0x18;
        iVar12 = uVar51 + uVar22 + ((uVar14 ^ uVar19) & uVar42 ^ uVar19) +
                 ((uVar42 * 0x80 | uVar42 >> 0x19) ^
                 (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
                 0x3956c25b;
        uVar9 = uVar9 + iVar12;
        uVar57 = ((uVar46 | uVar35) & uVar27 | uVar46 & uVar35) +
                 ((uVar46 * 0x400 | uVar46 >> 0x16) ^
                 (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar12;
        uVar51 = *(uint *)(hash->buf + 0x14);
        uVar58 = uVar51 >> 0x18 | (uVar51 & 0xff0000) >> 8 | (uVar51 & 0xff00) << 8;
        uVar23 = uVar58 | uVar51 << 0x18;
        iVar12 = uVar19 + uVar23 + ((uVar42 ^ uVar14) & uVar9 ^ uVar14) +
                 ((uVar9 * 0x80 | uVar9 >> 0x19) ^
                 (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) + 0x59f111f1;
        uVar27 = uVar27 + iVar12;
        uVar24 = ((uVar57 | uVar46) & uVar35 | uVar57 & uVar46) +
                 ((uVar57 * 0x400 | uVar57 >> 0x16) ^
                 (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar12;
        uVar19 = *(uint *)(hash->buf + 0x18);
        uVar59 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8;
        uVar52 = uVar59 | uVar19 << 0x18;
        iVar12 = uVar14 + uVar52 + ((uVar9 ^ uVar42) & uVar27 ^ uVar42) +
                 ((uVar27 * 0x80 | uVar27 >> 0x19) ^
                 (uVar27 * 0x200000 | uVar27 >> 0xb) ^ (uVar27 * 0x4000000 | uVar27 >> 6)) +
                 -0x6dc07d5c;
        uVar35 = uVar35 + iVar12;
        uVar20 = ((uVar24 | uVar57) & uVar46 | uVar24 & uVar57) +
                 ((uVar24 * 0x400 | uVar24 >> 0x16) ^
                 (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar12;
        uVar14 = *(uint *)(hash->buf + 0x1c);
        uVar60 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8;
        uVar53 = uVar60 | uVar14 << 0x18;
        iVar12 = ((uVar35 * 0x80 | uVar35 >> 0x19) ^
                 (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6)) +
                 uVar42 + uVar53 + ((uVar27 ^ uVar9) & uVar35 ^ uVar9) + -0x54e3a12b;
        uVar46 = uVar46 + iVar12;
        uVar54 = ((uVar20 | uVar24) & uVar57 | uVar20 & uVar24) +
                 ((uVar20 * 0x400 | uVar20 >> 0x16) ^
                 (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar12;
        uVar42 = *(uint *)(hash->buf + 0x20);
        uVar62 = uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8;
        uVar43 = uVar62 | uVar42 << 0x18;
        iVar12 = uVar9 + uVar43 + ((uVar35 ^ uVar27) & uVar46 ^ uVar27) +
                 ((uVar46 * 0x80 | uVar46 >> 0x19) ^
                 (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6)) +
                 -0x27f85568;
        uVar57 = uVar57 + iVar12;
        uVar15 = ((uVar54 | uVar20) & uVar24 | uVar54 & uVar20) +
                 ((uVar54 * 0x400 | uVar54 >> 0x16) ^
                 (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar12;
        uVar9 = *(uint *)(hash->buf + 0x24);
        uVar63 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8;
        uVar44 = uVar63 | uVar9 << 0x18;
        iVar12 = ((uVar57 * 0x80 | uVar57 >> 0x19) ^
                 (uVar57 * 0x200000 | uVar57 >> 0xb) ^ (uVar57 * 0x4000000 | uVar57 >> 6)) +
                 uVar27 + uVar44 + ((uVar46 ^ uVar35) & uVar57 ^ uVar35) + 0x12835b01;
        uVar24 = uVar24 + iVar12;
        uVar45 = ((uVar15 | uVar54) & uVar20 | uVar15 & uVar54) +
                 ((uVar15 * 0x400 | uVar15 >> 0x16) ^
                 (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar12;
        uVar27 = *(uint *)(hash->buf + 0x28);
        uVar64 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8;
        uVar28 = uVar64 | uVar27 << 0x18;
        iVar12 = ((uVar24 * 0x80 | uVar24 >> 0x19) ^
                 (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6)) +
                 uVar35 + uVar28 + ((uVar57 ^ uVar46) & uVar24 ^ uVar46) + 0x243185be;
        uVar20 = uVar20 + iVar12;
        uVar61 = ((uVar45 | uVar15) & uVar54 | uVar45 & uVar15) +
                 ((uVar45 * 0x400 | uVar45 >> 0x16) ^
                 (uVar45 * 0x80000 | uVar45 >> 0xd) ^ (uVar45 * 0x40000000 | uVar45 >> 2)) + iVar12;
        uVar35 = *(uint *)(hash->buf + 0x2c);
        uVar65 = uVar35 >> 0x18 | (uVar35 & 0xff0000) >> 8 | (uVar35 & 0xff00) << 8;
        uVar29 = uVar65 | uVar35 << 0x18;
        iVar12 = ((uVar20 * 0x80 | uVar20 >> 0x19) ^
                 (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6)) +
                 uVar46 + uVar29 + ((uVar24 ^ uVar57) & uVar20 ^ uVar57) + 0x550c7dc3;
        uVar54 = uVar54 + iVar12;
        uVar47 = ((uVar61 | uVar45) & uVar15 | uVar61 & uVar45) +
                 ((uVar61 * 0x400 | uVar61 >> 0x16) ^
                 (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar12;
        uVar46 = *(uint *)(hash->buf + 0x30);
        uVar66 = uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 | (uVar46 & 0xff00) << 8;
        uVar30 = uVar66 | uVar46 << 0x18;
        iVar12 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
                 (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
                 uVar57 + uVar30 + ((uVar20 ^ uVar24) & uVar54 ^ uVar24) + 0x72be5d74;
        uVar15 = uVar15 + iVar12;
        uVar48 = ((uVar47 | uVar61) & uVar45 | uVar47 & uVar61) +
                 ((uVar47 * 0x400 | uVar47 >> 0x16) ^
                 (uVar47 * 0x80000 | uVar47 >> 0xd) ^ (uVar47 * 0x40000000 | uVar47 >> 2)) + iVar12;
        uVar57 = *(uint *)(hash->buf + 0x34);
        uVar67 = uVar57 >> 0x18 | (uVar57 & 0xff0000) >> 8 | (uVar57 & 0xff00) << 8;
        uVar31 = uVar67 | uVar57 << 0x18;
        iVar12 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
                 (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
                 uVar24 + uVar31 + ((uVar54 ^ uVar20) & uVar15 ^ uVar20) + -0x7f214e02;
        uVar45 = uVar45 + iVar12;
        uVar68 = ((uVar48 | uVar47) & uVar61 | uVar48 & uVar47) +
                 ((uVar48 * 0x400 | uVar48 >> 0x16) ^
                 (uVar48 * 0x80000 | uVar48 >> 0xd) ^ (uVar48 * 0x40000000 | uVar48 >> 2)) + iVar12;
        uVar32 = (uint)hash->buf[0x39] << 0x10 | (uint)hash->buf[0x38] << 0x18;
        uVar49 = (uint)hash->buf[0x3a] << 8 | uVar32;
        uVar33 = hash->buf[0x3b] | uVar49;
        iVar12 = ((uVar45 * 0x80 | uVar45 >> 0x19) ^
                 (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6)) +
                 uVar20 + uVar33 + ((uVar15 ^ uVar54) & uVar45 ^ uVar54) + -0x6423f959;
        uVar61 = uVar61 + iVar12;
        uVar36 = ((uVar68 | uVar48) & uVar47 | uVar68 & uVar48) +
                 ((uVar68 * 0x400 | uVar68 >> 0x16) ^
                 (uVar68 * 0x80000 | uVar68 >> 0xd) ^ (uVar68 * 0x40000000 | uVar68 >> 2)) + iVar12;
        uVar24 = (uint)hash->buf[0x3d] << 0x10 | (uint)hash->buf[0x3c] << 0x18;
        uVar20 = (uint)hash->buf[0x3e] << 8 | uVar24;
        uVar34 = hash->buf[0x3f] | uVar20;
        iVar12 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
                 (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
                 uVar54 + uVar34 + ((uVar45 ^ uVar15) & uVar61 ^ uVar15) + -0x3e640e8c;
        uVar47 = uVar47 + iVar12;
        uVar54 = ((uVar36 | uVar68) & uVar48 | uVar36 & uVar68) +
                 ((uVar36 * 0x400 | uVar36 >> 0x16) ^
                 (uVar36 * 0x80000 | uVar36 >> 0xd) ^ (uVar36 * 0x40000000 | uVar36 >> 2)) + iVar12;
        uVar49 = uVar50 + uVar44 +
                 (uVar17 >> 3 ^
                 (uVar25 << 0xe | uVar17 >> 0x12) ^ ((uVar10 >> 0x18) << 0x19 | uVar17 >> 7)) +
                 (uVar49 >> 10 ^ (uVar33 << 0xd | uVar32 >> 0x13) ^ (uVar33 << 0xf | uVar32 >> 0x11)
                 );
        iVar12 = uVar15 + uVar49 + ((uVar61 ^ uVar45) & uVar47 ^ uVar45) +
                 ((uVar47 * 0x80 | uVar47 >> 0x19) ^
                 (uVar47 * 0x200000 | uVar47 >> 0xb) ^ (uVar47 * 0x4000000 | uVar47 >> 6)) +
                 -0x1b64963f;
        uVar48 = uVar48 + iVar12;
        uVar15 = ((uVar54 | uVar36) & uVar68 | uVar54 & uVar36) +
                 ((uVar54 * 0x400 | uVar54 >> 0x16) ^
                 (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar12;
        uVar20 = uVar17 + uVar28 +
                 (uVar40 >> 3 ^
                 (uVar26 << 0xe | uVar40 >> 0x12) ^ ((uVar18 >> 0x18) << 0x19 | uVar40 >> 7)) +
                 (uVar20 >> 10 ^ (uVar34 << 0xd | uVar24 >> 0x13) ^ (uVar34 << 0xf | uVar24 >> 0x11)
                 );
        iVar12 = ((uVar48 * 0x80 | uVar48 >> 0x19) ^
                 (uVar48 * 0x200000 | uVar48 >> 0xb) ^ (uVar48 * 0x4000000 | uVar48 >> 6)) +
                 uVar45 + uVar20 + ((uVar47 ^ uVar61) & uVar48 ^ uVar61) + -0x1041b87a;
        uVar68 = uVar68 + iVar12;
        uVar17 = ((uVar15 | uVar54) & uVar36 | uVar15 & uVar54) +
                 ((uVar15 * 0x400 | uVar15 >> 0x16) ^
                 (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar12;
        uVar45 = uVar40 + uVar29 +
                 (uVar56 >> 3 ^
                 (uVar37 << 0xe | uVar56 >> 0x12) ^ ((uVar13 >> 0x18) << 0x19 | uVar56 >> 7)) +
                 (uVar49 >> 10 ^
                 (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11));
        iVar12 = ((uVar68 * 0x80 | uVar68 >> 0x19) ^
                 (uVar68 * 0x200000 | uVar68 >> 0xb) ^ (uVar68 * 0x4000000 | uVar68 >> 6)) +
                 uVar61 + uVar45 + ((uVar48 ^ uVar47) & uVar68 ^ uVar47) + 0xfc19dc6;
        uVar36 = uVar36 + iVar12;
        uVar40 = ((uVar17 | uVar15) & uVar54 | uVar17 & uVar15) +
                 ((uVar17 * 0x400 | uVar17 >> 0x16) ^
                 (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar12;
        uVar25 = uVar56 + uVar30 +
                 (uVar22 >> 3 ^
                 (uVar55 << 0xe | uVar22 >> 0x12) ^ ((uVar41 >> 0x18) << 0x19 | uVar22 >> 7)) +
                 (uVar20 >> 10 ^
                 (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11));
        iVar12 = ((uVar36 * 0x80 | uVar36 >> 0x19) ^
                 (uVar36 * 0x200000 | uVar36 >> 0xb) ^ (uVar36 * 0x4000000 | uVar36 >> 6)) +
                 uVar47 + uVar25 + ((uVar68 ^ uVar48) & uVar36 ^ uVar48) + 0x240ca1cc;
        uVar54 = uVar54 + iVar12;
        uVar18 = ((uVar40 | uVar17) & uVar15 | uVar40 & uVar17) +
                 ((uVar40 * 0x400 | uVar40 >> 0x16) ^
                 (uVar40 * 0x80000 | uVar40 >> 0xd) ^ (uVar40 * 0x40000000 | uVar40 >> 2)) + iVar12;
        uVar26 = uVar22 + uVar31 +
                 (uVar23 >> 3 ^
                 (uVar58 << 0xe | uVar23 >> 0x12) ^ ((uVar51 >> 0x18) << 0x19 | uVar23 >> 7)) +
                 (uVar45 >> 10 ^
                 (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
        iVar12 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
                 (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
                 uVar48 + uVar26 + ((uVar36 ^ uVar68) & uVar54 ^ uVar68) + 0x2de92c6f;
        uVar15 = uVar15 + iVar12;
        uVar41 = ((uVar18 | uVar40) & uVar17 | uVar18 & uVar40) +
                 ((uVar18 * 0x400 | uVar18 >> 0x16) ^
                 (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar12;
        uVar13 = uVar23 + uVar33 +
                 (uVar52 >> 3 ^
                 (uVar59 << 0xe | uVar52 >> 0x12) ^ ((uVar19 >> 0x18) << 0x19 | uVar52 >> 7)) +
                 (uVar25 >> 10 ^
                 (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11));
        iVar12 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
                 (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
                 uVar68 + uVar13 + ((uVar54 ^ uVar36) & uVar15 ^ uVar36) + 0x4a7484aa;
        uVar17 = uVar17 + iVar12;
        uVar37 = ((uVar41 | uVar18) & uVar40 | uVar41 & uVar18) +
                 ((uVar41 * 0x400 | uVar41 >> 0x16) ^
                 (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar12;
        uVar19 = uVar52 + uVar34 +
                 (uVar53 >> 3 ^
                 (uVar60 << 0xe | uVar53 >> 0x12) ^ ((uVar14 >> 0x18) << 0x19 | uVar53 >> 7)) +
                 (uVar26 >> 10 ^
                 (uVar26 * 0x2000 | uVar26 >> 0x13) ^ (uVar26 * 0x8000 | uVar26 >> 0x11));
        iVar12 = ((uVar17 * 0x80 | uVar17 >> 0x19) ^
                 (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6)) +
                 uVar36 + uVar19 + ((uVar15 ^ uVar54) & uVar17 ^ uVar54) + 0x5cb0a9dc;
        uVar40 = uVar40 + iVar12;
        uVar14 = ((uVar37 | uVar41) & uVar18 | uVar37 & uVar41) +
                 ((uVar37 * 0x400 | uVar37 >> 0x16) ^
                 (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar12;
        uVar68 = (uVar43 >> 3 ^
                 (uVar62 << 0xe | uVar43 >> 0x12) ^ ((uVar42 >> 0x18) << 0x19 | uVar43 >> 7)) +
                 uVar53 + uVar49 +
                 (uVar13 >> 10 ^
                 (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11));
        iVar12 = ((uVar40 * 0x80 | uVar40 >> 0x19) ^
                 (uVar40 * 0x200000 | uVar40 >> 0xb) ^ (uVar40 * 0x4000000 | uVar40 >> 6)) +
                 uVar54 + uVar68 + ((uVar17 ^ uVar15) & uVar40 ^ uVar15) + 0x76f988da;
        uVar18 = uVar18 + iVar12;
        uVar10 = ((uVar14 | uVar37) & uVar41 | uVar14 & uVar37) +
                 ((uVar14 * 0x400 | uVar14 >> 0x16) ^
                 (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar12;
        uVar59 = (uVar44 >> 3 ^
                 (uVar63 << 0xe | uVar44 >> 0x12) ^ ((uVar9 >> 0x18) << 0x19 | uVar44 >> 7)) +
                 uVar43 + uVar20 +
                 (uVar19 >> 10 ^
                 (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11));
        iVar12 = ((uVar18 * 0x80 | uVar18 >> 0x19) ^
                 (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6)) +
                 uVar15 + uVar59 + ((uVar40 ^ uVar17) & uVar18 ^ uVar17) + -0x67c1aeae;
        uVar41 = uVar41 + iVar12;
        uVar51 = ((uVar10 | uVar14) & uVar37 | uVar10 & uVar14) +
                 ((uVar10 * 0x400 | uVar10 >> 0x16) ^
                 (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar12;
        uVar9 = (uVar28 >> 3 ^
                (uVar64 << 0xe | uVar28 >> 0x12) ^ ((uVar27 >> 0x18) << 0x19 | uVar28 >> 7)) +
                uVar44 + uVar45 +
                (uVar68 >> 10 ^
                (uVar68 * 0x2000 | uVar68 >> 0x13) ^ (uVar68 * 0x8000 | uVar68 >> 0x11));
        iVar12 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
                 (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
                 uVar17 + uVar9 + ((uVar18 ^ uVar40) & uVar41 ^ uVar40) + -0x57ce3993;
        uVar37 = uVar37 + iVar12;
        uVar58 = ((uVar51 | uVar10) & uVar14 | uVar51 & uVar10) +
                 ((uVar51 * 0x400 | uVar51 >> 0x16) ^
                 (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar12;
        uVar27 = (uVar29 >> 3 ^
                 (uVar65 << 0xe | uVar29 >> 0x12) ^ ((uVar35 >> 0x18) << 0x19 | uVar29 >> 7)) +
                 uVar28 + uVar25 +
                 (uVar59 >> 10 ^
                 (uVar59 * 0x2000 | uVar59 >> 0x13) ^ (uVar59 * 0x8000 | uVar59 >> 0x11));
        iVar12 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
                 (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
                 uVar40 + uVar27 + ((uVar41 ^ uVar18) & uVar37 ^ uVar18) + -0x4ffcd838;
        uVar14 = uVar14 + iVar12;
        uVar55 = ((uVar58 | uVar51) & uVar10 | uVar58 & uVar51) +
                 ((uVar58 * 0x400 | uVar58 >> 0x16) ^
                 (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar12;
        uVar15 = (uVar30 >> 3 ^
                 (uVar66 << 0xe | uVar30 >> 0x12) ^ ((uVar46 >> 0x18) << 0x19 | uVar30 >> 7)) +
                 uVar29 + uVar26 +
                 (uVar9 >> 10 ^ (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11))
        ;
        iVar12 = uVar18 + uVar15 + ((uVar37 ^ uVar41) & uVar14 ^ uVar41) +
                 ((uVar14 * 0x80 | uVar14 >> 0x19) ^
                 (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
                 -0x40a68039;
        uVar10 = uVar10 + iVar12;
        uVar35 = ((uVar55 | uVar58) & uVar51 | uVar55 & uVar58) +
                 ((uVar55 * 0x400 | uVar55 >> 0x16) ^
                 (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar12;
        uVar57 = (uVar31 >> 3 ^
                 (uVar67 << 0xe | uVar31 >> 0x12) ^ ((uVar57 >> 0x18) << 0x19 | uVar31 >> 7)) +
                 uVar30 + uVar13 +
                 (uVar27 >> 10 ^
                 (uVar27 * 0x2000 | uVar27 >> 0x13) ^ (uVar27 * 0x8000 | uVar27 >> 0x11));
        iVar12 = uVar41 + uVar57 + ((uVar14 ^ uVar37) & uVar10 ^ uVar37) +
                 ((uVar10 * 0x80 | uVar10 >> 0x19) ^
                 (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
                 -0x391ff40d;
        uVar51 = uVar51 + iVar12;
        uVar18 = ((uVar35 | uVar55) & uVar58 | uVar35 & uVar55) +
                 ((uVar35 * 0x400 | uVar35 >> 0x16) ^
                 (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar12;
        uVar17 = (uVar33 >> 3 ^
                 (uVar33 << 0xe | uVar32 >> 0x12) ^ ((uint)hash->buf[0x3b] << 0x19 | uVar33 >> 7)) +
                 uVar31 + uVar19 +
                 (uVar15 >> 10 ^
                 (uVar15 * 0x2000 | uVar15 >> 0x13) ^ (uVar15 * 0x8000 | uVar15 >> 0x11));
        iVar12 = ((uVar51 * 0x80 | uVar51 >> 0x19) ^
                 (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6)) +
                 uVar37 + uVar17 + ((uVar10 ^ uVar14) & uVar51 ^ uVar14) + -0x2a586eb9;
        uVar58 = uVar58 + iVar12;
        uVar42 = ((uVar18 | uVar35) & uVar55 | uVar18 & uVar35) +
                 ((uVar18 * 0x400 | uVar18 >> 0x16) ^
                 (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar12;
        uVar62 = (uVar34 >> 3 ^
                 (uVar34 << 0xe | uVar24 >> 0x12) ^ ((uint)hash->buf[0x3f] << 0x19 | uVar34 >> 7)) +
                 uVar33 + uVar68 +
                 (uVar57 >> 10 ^
                 (uVar57 * 0x2000 | uVar57 >> 0x13) ^ (uVar57 * 0x8000 | uVar57 >> 0x11));
        iVar12 = ((uVar58 * 0x80 | uVar58 >> 0x19) ^
                 (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6)) +
                 uVar14 + uVar62 + ((uVar51 ^ uVar10) & uVar58 ^ uVar10) + 0x6ca6351;
        uVar55 = uVar55 + iVar12;
        uVar14 = ((uVar42 | uVar18) & uVar35 | uVar42 & uVar18) +
                 ((uVar42 * 0x400 | uVar42 >> 0x16) ^
                 (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar12;
        uVar60 = (uVar49 >> 3 ^
                 (uVar49 * 0x4000 | uVar49 >> 0x12) ^ (uVar49 * 0x2000000 | uVar49 >> 7)) + uVar34 +
                 uVar59 + (uVar17 >> 10 ^
                          (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11));
        iVar12 = uVar10 + uVar60 + ((uVar58 ^ uVar51) & uVar55 ^ uVar51) +
                 ((uVar55 * 0x80 | uVar55 >> 0x19) ^
                 (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
                 0x14292967;
        uVar35 = uVar35 + iVar12;
        uVar10 = ((uVar14 | uVar42) & uVar18 | uVar14 & uVar42) +
                 ((uVar14 * 0x400 | uVar14 >> 0x16) ^
                 (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar12;
        uVar63 = (uVar20 >> 3 ^
                 (uVar20 * 0x4000 | uVar20 >> 0x12) ^ (uVar20 * 0x2000000 | uVar20 >> 7)) + uVar49 +
                 uVar9 + (uVar62 >> 10 ^
                         (uVar62 * 0x2000 | uVar62 >> 0x13) ^ (uVar62 * 0x8000 | uVar62 >> 0x11));
        iVar12 = ((uVar35 * 0x80 | uVar35 >> 0x19) ^
                 (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6)) +
                 uVar51 + uVar63 + ((uVar55 ^ uVar58) & uVar35 ^ uVar58) + 0x27b70a85;
        uVar18 = uVar18 + iVar12;
        uVar51 = ((uVar10 | uVar14) & uVar42 | uVar10 & uVar14) +
                 ((uVar10 * 0x400 | uVar10 >> 0x16) ^
                 (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar12;
        uVar64 = (uVar45 >> 3 ^
                 (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7)) + uVar20 +
                 uVar27 + (uVar60 >> 10 ^
                          (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11));
        iVar12 = ((uVar18 * 0x80 | uVar18 >> 0x19) ^
                 (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6)) +
                 uVar58 + uVar64 + ((uVar35 ^ uVar55) & uVar18 ^ uVar55) + 0x2e1b2138;
        uVar42 = uVar42 + iVar12;
        uVar58 = ((uVar51 | uVar10) & uVar14 | uVar51 & uVar10) +
                 ((uVar51 * 0x400 | uVar51 >> 0x16) ^
                 (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar12;
        uVar37 = (uVar25 >> 3 ^
                 (uVar25 * 0x4000 | uVar25 >> 0x12) ^ (uVar25 * 0x2000000 | uVar25 >> 7)) + uVar45 +
                 uVar15 + (uVar63 >> 10 ^
                          (uVar63 * 0x2000 | uVar63 >> 0x13) ^ (uVar63 * 0x8000 | uVar63 >> 0x11));
        iVar12 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
                 (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
                 uVar55 + uVar37 + ((uVar18 ^ uVar35) & uVar42 ^ uVar35) + 0x4d2c6dfc;
        uVar14 = uVar14 + iVar12;
        uVar46 = ((uVar58 | uVar51) & uVar10 | uVar58 & uVar51) +
                 ((uVar58 * 0x400 | uVar58 >> 0x16) ^
                 (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar12;
        uVar20 = (uVar26 >> 3 ^
                 (uVar26 * 0x4000 | uVar26 >> 0x12) ^ (uVar26 * 0x2000000 | uVar26 >> 7)) + uVar25 +
                 uVar57 + (uVar64 >> 10 ^
                          (uVar64 * 0x2000 | uVar64 >> 0x13) ^ (uVar64 * 0x8000 | uVar64 >> 0x11));
        iVar12 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
                 (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
                 uVar35 + uVar20 + ((uVar42 ^ uVar18) & uVar14 ^ uVar18) + 0x53380d13;
        uVar10 = uVar10 + iVar12;
        uVar41 = ((uVar46 | uVar58) & uVar51 | uVar46 & uVar58) +
                 ((uVar46 * 0x400 | uVar46 >> 0x16) ^
                 (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar12;
        uVar55 = (uVar13 >> 3 ^
                 (uVar13 * 0x4000 | uVar13 >> 0x12) ^ (uVar13 * 0x2000000 | uVar13 >> 7)) + uVar26 +
                 uVar17 + (uVar37 >> 10 ^
                          (uVar37 * 0x2000 | uVar37 >> 0x13) ^ (uVar37 * 0x8000 | uVar37 >> 0x11));
        iVar12 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
                 (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
                 uVar18 + uVar55 + ((uVar14 ^ uVar42) & uVar10 ^ uVar42) + 0x650a7354;
        uVar51 = uVar51 + iVar12;
        uVar35 = ((uVar41 | uVar46) & uVar58 | uVar41 & uVar46) +
                 ((uVar41 * 0x400 | uVar41 >> 0x16) ^
                 (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar12;
        uVar65 = (uVar19 >> 3 ^
                 (uVar19 * 0x4000 | uVar19 >> 0x12) ^ (uVar19 * 0x2000000 | uVar19 >> 7)) + uVar13 +
                 uVar62 + (uVar20 >> 10 ^
                          (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11));
        iVar12 = ((uVar51 * 0x80 | uVar51 >> 0x19) ^
                 (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6)) +
                 uVar42 + uVar65 + ((uVar10 ^ uVar14) & uVar51 ^ uVar14) + 0x766a0abb;
        uVar58 = uVar58 + iVar12;
        uVar26 = ((uVar35 | uVar41) & uVar46 | uVar35 & uVar41) +
                 ((uVar35 * 0x400 | uVar35 >> 0x16) ^
                 (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar12;
        uVar66 = (uVar68 >> 3 ^
                 (uVar68 * 0x4000 | uVar68 >> 0x12) ^ (uVar68 * 0x2000000 | uVar68 >> 7)) + uVar19 +
                 uVar60 + (uVar55 >> 10 ^
                          (uVar55 * 0x2000 | uVar55 >> 0x13) ^ (uVar55 * 0x8000 | uVar55 >> 0x11));
        iVar12 = ((uVar58 * 0x80 | uVar58 >> 0x19) ^
                 (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6)) +
                 uVar14 + uVar66 + ((uVar51 ^ uVar10) & uVar58 ^ uVar10) + -0x7e3d36d2;
        uVar46 = uVar46 + iVar12;
        uVar13 = ((uVar26 | uVar35) & uVar41 | uVar26 & uVar35) +
                 ((uVar26 * 0x400 | uVar26 >> 0x16) ^
                 (uVar26 * 0x80000 | uVar26 >> 0xd) ^ (uVar26 * 0x40000000 | uVar26 >> 2)) + iVar12;
        uVar24 = (uVar59 >> 3 ^
                 (uVar59 * 0x4000 | uVar59 >> 0x12) ^ (uVar59 * 0x2000000 | uVar59 >> 7)) + uVar68 +
                 uVar63 + (uVar65 >> 10 ^
                          (uVar65 * 0x2000 | uVar65 >> 0x13) ^ (uVar65 * 0x8000 | uVar65 >> 0x11));
        iVar12 = ((uVar46 * 0x80 | uVar46 >> 0x19) ^
                 (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6)) +
                 uVar10 + uVar24 + ((uVar58 ^ uVar51) & uVar46 ^ uVar51) + -0x6d8dd37b;
        uVar41 = uVar41 + iVar12;
        uVar42 = ((uVar13 | uVar26) & uVar35 | uVar13 & uVar26) +
                 ((uVar13 * 0x400 | uVar13 >> 0x16) ^
                 (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar12;
        uVar68 = (uVar9 >> 3 ^ (uVar9 * 0x4000 | uVar9 >> 0x12) ^ (uVar9 * 0x2000000 | uVar9 >> 7))
                 + uVar59 + uVar64 +
                 (uVar66 >> 10 ^
                 (uVar66 * 0x2000 | uVar66 >> 0x13) ^ (uVar66 * 0x8000 | uVar66 >> 0x11));
        iVar12 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
                 (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
                 uVar51 + uVar68 + ((uVar46 ^ uVar58) & uVar41 ^ uVar58) + -0x5d40175f;
        uVar35 = uVar35 + iVar12;
        uVar10 = ((uVar42 | uVar13) & uVar26 | uVar42 & uVar13) +
                 ((uVar42 * 0x400 | uVar42 >> 0x16) ^
                 (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar12;
        uVar51 = (uVar27 >> 3 ^
                 (uVar27 * 0x4000 | uVar27 >> 0x12) ^ (uVar27 * 0x2000000 | uVar27 >> 7)) + uVar9 +
                 uVar37 + (uVar24 >> 10 ^
                          (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11));
        iVar12 = ((uVar35 * 0x80 | uVar35 >> 0x19) ^
                 (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6)) +
                 uVar58 + uVar51 + ((uVar41 ^ uVar46) & uVar35 ^ uVar46) + -0x57e599b5;
        uVar26 = uVar26 + iVar12;
        uVar18 = ((uVar10 | uVar42) & uVar13 | uVar10 & uVar42) +
                 ((uVar10 * 0x400 | uVar10 >> 0x16) ^
                 (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar12;
        uVar22 = (uVar15 >> 3 ^
                 (uVar15 * 0x4000 | uVar15 >> 0x12) ^ (uVar15 * 0x2000000 | uVar15 >> 7)) + uVar27 +
                 uVar20 + (uVar68 >> 10 ^
                          (uVar68 * 0x2000 | uVar68 >> 0x13) ^ (uVar68 * 0x8000 | uVar68 >> 0x11));
        iVar12 = ((uVar26 * 0x80 | uVar26 >> 0x19) ^
                 (uVar26 * 0x200000 | uVar26 >> 0xb) ^ (uVar26 * 0x4000000 | uVar26 >> 6)) +
                 uVar46 + uVar22 + ((uVar35 ^ uVar41) & uVar26 ^ uVar41) + -0x3db47490;
        uVar13 = uVar13 + iVar12;
        uVar67 = ((uVar18 | uVar10) & uVar42 | uVar18 & uVar10) +
                 ((uVar18 * 0x400 | uVar18 >> 0x16) ^
                 (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar12;
        uVar19 = (uVar57 >> 3 ^
                 (uVar57 * 0x4000 | uVar57 >> 0x12) ^ (uVar57 * 0x2000000 | uVar57 >> 7)) + uVar15 +
                 uVar55 + (uVar51 >> 10 ^
                          (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11));
        iVar12 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
                 (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
                 uVar41 + uVar19 + ((uVar26 ^ uVar35) & uVar13 ^ uVar35) + -0x3893ae5d;
        uVar42 = uVar42 + iVar12;
        uVar14 = ((uVar67 | uVar18) & uVar10 | uVar67 & uVar18) +
                 ((uVar67 * 0x400 | uVar67 >> 0x16) ^
                 (uVar67 * 0x80000 | uVar67 >> 0xd) ^ (uVar67 * 0x40000000 | uVar67 >> 2)) + iVar12;
        uVar57 = (uVar17 >> 3 ^
                 (uVar17 * 0x4000 | uVar17 >> 0x12) ^ (uVar17 * 0x2000000 | uVar17 >> 7)) + uVar57 +
                 uVar65 + (uVar22 >> 10 ^
                          (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11));
        iVar12 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
                 (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
                 uVar35 + uVar57 + ((uVar13 ^ uVar26) & uVar42 ^ uVar26) + -0x2e6d17e7;
        uVar10 = uVar10 + iVar12;
        uVar41 = ((uVar14 | uVar67) & uVar18 | uVar14 & uVar67) +
                 ((uVar14 * 0x400 | uVar14 >> 0x16) ^
                 (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar12;
        uVar25 = (uVar62 >> 3 ^
                 (uVar62 * 0x4000 | uVar62 >> 0x12) ^ (uVar62 * 0x2000000 | uVar62 >> 7)) + uVar17 +
                 uVar66 + (uVar19 >> 10 ^
                          (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11));
        iVar12 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
                 (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
                 uVar26 + uVar25 + ((uVar42 ^ uVar13) & uVar10 ^ uVar13) + -0x2966f9dc;
        uVar18 = uVar18 + iVar12;
        uVar35 = ((uVar41 | uVar14) & uVar67 | uVar41 & uVar14) +
                 ((uVar41 * 0x400 | uVar41 >> 0x16) ^
                 (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar12;
        uVar27 = (uVar60 >> 3 ^
                 (uVar60 * 0x4000 | uVar60 >> 0x12) ^ (uVar60 * 0x2000000 | uVar60 >> 7)) + uVar62 +
                 uVar24 + (uVar57 >> 10 ^
                          (uVar57 * 0x2000 | uVar57 >> 0x13) ^ (uVar57 * 0x8000 | uVar57 >> 0x11));
        iVar12 = ((uVar18 * 0x80 | uVar18 >> 0x19) ^
                 (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6)) +
                 uVar13 + uVar27 + ((uVar10 ^ uVar42) & uVar18 ^ uVar42) + -0xbf1ca7b;
        uVar67 = uVar67 + iVar12;
        uVar46 = ((uVar35 | uVar41) & uVar14 | uVar35 & uVar41) +
                 ((uVar35 * 0x400 | uVar35 >> 0x16) ^
                 (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar12;
        uVar26 = (uVar63 >> 3 ^
                 (uVar63 * 0x4000 | uVar63 >> 0x12) ^ (uVar63 * 0x2000000 | uVar63 >> 7)) + uVar60 +
                 uVar68 + (uVar25 >> 10 ^
                          (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11));
        iVar12 = ((uVar67 * 0x80 | uVar67 >> 0x19) ^
                 (uVar67 * 0x200000 | uVar67 >> 0xb) ^ (uVar67 * 0x4000000 | uVar67 >> 6)) +
                 uVar42 + uVar26 + ((uVar18 ^ uVar10) & uVar67 ^ uVar10) + 0x106aa070;
        uVar14 = uVar14 + iVar12;
        uVar59 = ((uVar46 | uVar35) & uVar41 | uVar46 & uVar35) +
                 ((uVar46 * 0x400 | uVar46 >> 0x16) ^
                 (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar12;
        uVar9 = (uVar64 >> 3 ^
                (uVar64 * 0x4000 | uVar64 >> 0x12) ^ (uVar64 * 0x2000000 | uVar64 >> 7)) + uVar63 +
                uVar51 + (uVar27 >> 10 ^
                         (uVar27 * 0x2000 | uVar27 >> 0x13) ^ (uVar27 * 0x8000 | uVar27 >> 0x11));
        iVar12 = uVar10 + uVar9 + ((uVar67 ^ uVar18) & uVar14 ^ uVar18) +
                 ((uVar14 * 0x80 | uVar14 >> 0x19) ^
                 (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
                 0x19a4c116;
        uVar41 = uVar41 + iVar12;
        uVar58 = ((uVar59 | uVar46) & uVar35 | uVar59 & uVar46) +
                 ((uVar59 * 0x400 | uVar59 >> 0x16) ^
                 (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar12;
        uVar42 = (uVar37 >> 3 ^
                 (uVar37 * 0x4000 | uVar37 >> 0x12) ^ (uVar37 * 0x2000000 | uVar37 >> 7)) + uVar64 +
                 uVar22 + (uVar26 >> 10 ^
                          (uVar26 * 0x2000 | uVar26 >> 0x13) ^ (uVar26 * 0x8000 | uVar26 >> 0x11));
        iVar12 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
                 (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
                 uVar18 + uVar42 + ((uVar14 ^ uVar67) & uVar41 ^ uVar67) + 0x1e376c08;
        uVar35 = uVar35 + iVar12;
        uVar10 = ((uVar58 | uVar59) & uVar46 | uVar58 & uVar59) +
                 ((uVar58 * 0x400 | uVar58 >> 0x16) ^
                 (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar12;
        uVar62 = (uVar20 >> 3 ^
                 (uVar20 * 0x4000 | uVar20 >> 0x12) ^ (uVar20 * 0x2000000 | uVar20 >> 7)) + uVar37 +
                 uVar19 + (uVar9 >> 10 ^
                          (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11));
        iVar12 = ((uVar35 * 0x80 | uVar35 >> 0x19) ^
                 (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6)) +
                 uVar67 + uVar62 + ((uVar41 ^ uVar14) & uVar35 ^ uVar14) + 0x2748774c;
        uVar46 = uVar46 + iVar12;
        uVar64 = ((uVar10 | uVar58) & uVar59 | uVar10 & uVar58) +
                 ((uVar10 * 0x400 | uVar10 >> 0x16) ^
                 (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar12;
        uVar18 = (uVar55 >> 3 ^
                 (uVar55 * 0x4000 | uVar55 >> 0x12) ^ (uVar55 * 0x2000000 | uVar55 >> 7)) + uVar20 +
                 uVar57 + (uVar42 >> 10 ^
                          (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
        iVar12 = ((uVar46 * 0x80 | uVar46 >> 0x19) ^
                 (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6)) +
                 uVar14 + uVar18 + ((uVar35 ^ uVar41) & uVar46 ^ uVar41) + 0x34b0bcb5;
        uVar59 = uVar59 + iVar12;
        uVar60 = ((uVar64 | uVar10) & uVar58 | uVar64 & uVar10) +
                 ((uVar64 * 0x400 | uVar64 >> 0x16) ^
                 (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar12;
        uVar13 = (uVar65 >> 3 ^
                 (uVar65 * 0x4000 | uVar65 >> 0x12) ^ (uVar65 * 0x2000000 | uVar65 >> 7)) + uVar55 +
                 uVar25 + (uVar62 >> 10 ^
                          (uVar62 * 0x2000 | uVar62 >> 0x13) ^ (uVar62 * 0x8000 | uVar62 >> 0x11));
        iVar12 = ((uVar59 * 0x80 | uVar59 >> 0x19) ^
                 (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6)) +
                 uVar41 + uVar13 + ((uVar46 ^ uVar35) & uVar59 ^ uVar35) + 0x391c0cb3;
        uVar58 = uVar58 + iVar12;
        uVar41 = ((uVar60 | uVar64) & uVar10 | uVar60 & uVar64) +
                 ((uVar60 * 0x400 | uVar60 >> 0x16) ^
                 (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar12;
        uVar37 = (uVar66 >> 3 ^
                 (uVar66 * 0x4000 | uVar66 >> 0x12) ^ (uVar66 * 0x2000000 | uVar66 >> 7)) + uVar65 +
                 uVar27 + (uVar18 >> 10 ^
                          (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11));
        iVar12 = ((uVar58 * 0x80 | uVar58 >> 0x19) ^
                 (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6)) +
                 uVar35 + uVar37 + ((uVar59 ^ uVar46) & uVar58 ^ uVar46) + 0x4ed8aa4a;
        uVar10 = uVar10 + iVar12;
        uVar63 = ((uVar41 | uVar60) & uVar64 | uVar41 & uVar60) +
                 ((uVar41 * 0x400 | uVar41 >> 0x16) ^
                 (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar12;
        uVar14 = (uVar24 >> 3 ^
                 (uVar24 * 0x4000 | uVar24 >> 0x12) ^ (uVar24 * 0x2000000 | uVar24 >> 7)) + uVar66 +
                 uVar26 + (uVar13 >> 10 ^
                          (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11));
        iVar12 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
                 (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
                 uVar46 + uVar14 + ((uVar58 ^ uVar59) & uVar10 ^ uVar59) + 0x5b9cca4f;
        uVar64 = uVar64 + iVar12;
        uVar46 = ((uVar63 | uVar41) & uVar60 | uVar63 & uVar41) +
                 ((uVar63 * 0x400 | uVar63 >> 0x16) ^
                 (uVar63 * 0x80000 | uVar63 >> 0xd) ^ (uVar63 * 0x40000000 | uVar63 >> 2)) + iVar12;
        uVar55 = (uVar68 >> 3 ^
                 (uVar68 * 0x4000 | uVar68 >> 0x12) ^ (uVar68 * 0x2000000 | uVar68 >> 7)) + uVar24 +
                 uVar9 + (uVar37 >> 10 ^
                         (uVar37 * 0x2000 | uVar37 >> 0x13) ^ (uVar37 * 0x8000 | uVar37 >> 0x11));
        iVar12 = ((uVar64 * 0x80 | uVar64 >> 0x19) ^
                 (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6)) +
                 uVar59 + uVar55 + ((uVar10 ^ uVar58) & uVar64 ^ uVar58) + 0x682e6ff3;
        uVar60 = uVar60 + iVar12;
        uVar35 = ((uVar46 | uVar63) & uVar41 | uVar46 & uVar63) +
                 ((uVar46 * 0x400 | uVar46 >> 0x16) ^
                 (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar12;
        uVar42 = (uVar51 >> 3 ^
                 (uVar51 * 0x4000 | uVar51 >> 0x12) ^ (uVar51 * 0x2000000 | uVar51 >> 7)) + uVar68 +
                 uVar42 + (uVar14 >> 10 ^
                          (uVar14 * 0x2000 | uVar14 >> 0x13) ^ (uVar14 * 0x8000 | uVar14 >> 0x11));
        iVar12 = ((uVar60 * 0x80 | uVar60 >> 0x19) ^
                 (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6)) +
                 uVar58 + uVar42 + ((uVar64 ^ uVar10) & uVar60 ^ uVar10) + 0x748f82ee;
        uVar41 = uVar41 + iVar12;
        uVar58 = ((uVar35 | uVar46) & uVar63 | uVar35 & uVar46) +
                 ((uVar35 * 0x400 | uVar35 >> 0x16) ^
                 (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar12;
        uVar51 = (uVar22 >> 3 ^
                 (uVar22 * 0x4000 | uVar22 >> 0x12) ^ (uVar22 * 0x2000000 | uVar22 >> 7)) + uVar51 +
                 uVar62 + (uVar55 >> 10 ^
                          (uVar55 * 0x2000 | uVar55 >> 0x13) ^ (uVar55 * 0x8000 | uVar55 >> 0x11));
        iVar12 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
                 (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
                 uVar10 + uVar51 + ((uVar60 ^ uVar64) & uVar41 ^ uVar64) + 0x78a5636f;
        uVar63 = uVar63 + iVar12;
        uVar59 = ((uVar58 | uVar35) & uVar46 | uVar58 & uVar35) +
                 ((uVar58 * 0x400 | uVar58 >> 0x16) ^
                 (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar12;
        uVar10 = (uVar19 >> 3 ^
                 (uVar19 * 0x4000 | uVar19 >> 0x12) ^ (uVar19 * 0x2000000 | uVar19 >> 7)) + uVar22 +
                 uVar18 + (uVar42 >> 10 ^
                          (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
        iVar12 = ((uVar63 * 0x80 | uVar63 >> 0x19) ^
                 (uVar63 * 0x200000 | uVar63 >> 0xb) ^ (uVar63 * 0x4000000 | uVar63 >> 6)) +
                 uVar64 + uVar10 + ((uVar41 ^ uVar60) & uVar63 ^ uVar60) + -0x7b3787ec;
        uVar46 = uVar46 + iVar12;
        uVar18 = ((uVar59 | uVar58) & uVar35 | uVar59 & uVar58) +
                 ((uVar59 * 0x400 | uVar59 >> 0x16) ^
                 (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar12;
        uVar13 = (uVar57 >> 3 ^
                 (uVar57 * 0x4000 | uVar57 >> 0x12) ^ (uVar57 * 0x2000000 | uVar57 >> 7)) + uVar19 +
                 uVar13 + (uVar51 >> 10 ^
                          (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11));
        iVar12 = ((uVar46 * 0x80 | uVar46 >> 0x19) ^
                 (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6)) +
                 uVar60 + uVar13 + ((uVar63 ^ uVar41) & uVar46 ^ uVar41) + -0x7338fdf8;
        uVar35 = uVar35 + iVar12;
        uVar51 = ((uVar18 | uVar59) & uVar58 | uVar18 & uVar59) +
                 ((uVar18 * 0x400 | uVar18 >> 0x16) ^
                 (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar12;
        uVar57 = (uVar25 >> 3 ^
                 (uVar25 * 0x4000 | uVar25 >> 0x12) ^ (uVar25 * 0x2000000 | uVar25 >> 7)) + uVar57 +
                 uVar37 + (uVar10 >> 10 ^
                          (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11));
        iVar12 = ((uVar35 * 0x80 | uVar35 >> 0x19) ^
                 (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6)) +
                 uVar41 + uVar57 + ((uVar46 ^ uVar63) & uVar35 ^ uVar63) + -0x6f410006;
        uVar58 = uVar58 + iVar12;
        uVar19 = ((uVar51 | uVar18) & uVar59 | uVar51 & uVar18) +
                 ((uVar51 * 0x400 | uVar51 >> 0x16) ^
                 (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar12;
        uVar13 = (uVar27 >> 3 ^
                 (uVar27 * 0x4000 | uVar27 >> 0x12) ^ (uVar27 * 0x2000000 | uVar27 >> 7)) + uVar25 +
                 uVar14 + (uVar13 >> 10 ^
                          (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11));
        iVar12 = ((uVar58 * 0x80 | uVar58 >> 0x19) ^
                 (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6)) +
                 uVar63 + uVar13 + ((uVar35 ^ uVar46) & uVar58 ^ uVar46) + -0x5baf9315;
        uVar59 = uVar59 + iVar12;
        uVar10 = ((uVar19 | uVar51) & uVar18 | uVar19 & uVar51) +
                 ((uVar19 * 0x400 | uVar19 >> 0x16) ^
                 (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar12;
        iVar12 = ((uVar59 * 0x80 | uVar59 >> 0x19) ^
                 (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6)) +
                 (uVar26 >> 3 ^
                 (uVar26 * 0x4000 | uVar26 >> 0x12) ^ (uVar26 * 0x2000000 | uVar26 >> 7)) + uVar27 +
                 uVar55 + (uVar57 >> 10 ^
                          (uVar57 * 0x2000 | uVar57 >> 0x13) ^ (uVar57 * 0x8000 | uVar57 >> 0x11)) +
                 uVar46 + ((uVar58 ^ uVar35) & uVar59 ^ uVar35) + -0x41065c09;
        uVar18 = uVar18 + iVar12;
        uVar41 = ((uVar10 | uVar19) & uVar51 | uVar10 & uVar19) +
                 ((uVar10 * 0x400 | uVar10 >> 0x16) ^
                 (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar12;
        iVar12 = ((uVar18 * 0x80 | uVar18 >> 0x19) ^
                 (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6)) +
                 (uVar9 >> 3 ^ (uVar9 * 0x4000 | uVar9 >> 0x12) ^ (uVar9 * 0x2000000 | uVar9 >> 7))
                 + uVar26 + uVar42 +
                 (uVar13 >> 10 ^
                 (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)) + uVar35 +
                 ((uVar59 ^ uVar58) & uVar18 ^ uVar58) + -0x398e870e;
        hash->s[0] = ((uVar41 | uVar10) & uVar19 | uVar41 & uVar10) + uVar16 +
                     ((uVar41 * 0x400 | uVar41 >> 0x16) ^
                     (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) +
                     iVar12;
        hash->s[1] = uVar41 + uVar21;
        hash->s[2] = uVar10 + uVar1;
        hash->s[3] = uVar19 + uVar2;
        hash->s[4] = uVar51 + uVar3 + iVar12;
        hash->s[5] = uVar18 + uVar4;
        hash->s[6] = uVar59 + uVar5;
        hash->s[7] = uVar58 + uVar6;
        __n = 0x40;
        uVar38 = 0;
      } while (0x3f < len);
    }
    if (len != 0) {
      memcpy(hash->buf + local_a8,data,len);
      return;
    }
    return;
  }
  secp256k1_sha256_write_cold_1();
  uVar38 = hash_00->bytes;
  uVar16 = (uint)(uVar38 >> 0x3d);
  if (uVar38 >> 0x3d == 0) {
    uStack_195 = (undefined1)(uVar38 >> 0x1d);
    uStack_196 = (undefined1)(uVar38 >> 0x25);
    uStack_197 = (undefined1)(uVar38 >> 0x2d);
    uStack_198 = (uchar)(uVar38 >> 0x35);
    cStack_191 = (char)uVar38 * '\b';
    uStack_192 = (undefined1)(uVar38 >> 5);
    uStack_193 = (undefined1)(uVar38 >> 0xd);
    uStack_194 = (undefined1)(uVar38 >> 0x15);
    secp256k1_sha256_write
              (hash_00,secp256k1_sha256_finalize::pad,(ulong)(0x37U - (int)uVar38 & 0x3f) + 1);
    secp256k1_sha256_write(hash_00,&uStack_198,8);
    lVar11 = 0;
    do {
      uVar16 = hash_00->s[lVar11];
      *(uint *)(((secp256k1_ecdsa_recoverable_signature *)data)->data + lVar11 * 4) =
           uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
      hash_00->s[lVar11] = 0;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 8);
    return;
  }
  secp256k1_sha256_finalize_cold_1();
  if (hash_00 == (secp256k1_sha256 *)0x0) {
    secp256k1_ecdsa_recoverable_signature_parse_compact_cold_4();
  }
  else if ((secp256k1_ecdsa_recoverable_signature *)data !=
           (secp256k1_ecdsa_recoverable_signature *)0x0) {
    if (extraout_RDX == 0) {
      secp256k1_ecdsa_recoverable_signature_parse_compact_cold_2();
      return;
    }
    if (uVar16 < 4) {
      lVar11 = 0;
      bVar8 = false;
      psVar39 = (secp256k1_scalar *)0x0;
      do {
        uVar21 = (uint)*(byte *)(extraout_RDX + lVar11) | (int)psVar39 << 8;
        uStack_1cc = uVar21 - (uVar21 / 0xd + (uVar21 / 0xd) * 0xc);
        if (uVar21 < 0xd) {
          uStack_1cc = uVar21;
        }
        psVar39 = (secp256k1_scalar *)(ulong)uStack_1cc;
        if (uVar21 >= 0xd) {
          bVar8 = true;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x20);
      secp256k1_scalar_verify(psVar39);
      lVar11 = 0;
      bVar7 = false;
      psVar39 = (secp256k1_scalar *)0x0;
      do {
        uVar21 = (uint)*(byte *)(extraout_RDX + 0x20 + lVar11) | (int)psVar39 << 8;
        uStack_1d0 = uVar21 - (uVar21 / 0xd + (uVar21 / 0xd) * 0xc);
        if (uVar21 < 0xd) {
          uStack_1d0 = uVar21;
        }
        psVar39 = (secp256k1_scalar *)(ulong)uStack_1d0;
        if (uVar21 >= 0xd) {
          bVar7 = true;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x20);
      secp256k1_scalar_verify(psVar39);
      if (bVar7 || bVar8) {
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x30] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x31] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x32] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x33] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x34] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x35] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x36] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x37] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x38] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x39] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x3a] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x3b] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x3c] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x3d] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x3e] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x3f] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x20] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x21] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x22] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x23] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x24] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x25] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x26] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x27] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x28] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x29] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x2a] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x2b] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x2c] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x2d] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x2e] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x2f] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x10] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x11] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x12] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x13] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x14] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x15] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x16] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x17] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x18] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x19] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x1a] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x1b] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x1c] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x1d] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x1e] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x1f] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[1] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[2] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[3] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[4] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[5] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[6] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[7] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[8] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[9] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[10] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0xb] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0xc] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0xd] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0xe] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0xf] = '\0';
        ((secp256k1_ecdsa_recoverable_signature *)data)->data[0x40] = '\0';
        return;
      }
      secp256k1_ecdsa_recoverable_signature_save
                ((secp256k1_ecdsa_recoverable_signature *)data,&uStack_1cc,&uStack_1d0,uVar16);
      return;
    }
    secp256k1_ecdsa_recoverable_signature_parse_compact_cold_1();
    return;
  }
  secp256k1_ecdsa_recoverable_signature_parse_compact_cold_3();
  return;
}

Assistant:

static void secp256k1_sha256_write(secp256k1_sha256 *hash, const unsigned char *data, size_t len) {
    size_t bufsize = hash->bytes & 0x3F;
    hash->bytes += len;
    VERIFY_CHECK(hash->bytes >= len);
    while (len >= 64 - bufsize) {
        /* Fill the buffer, and process it. */
        size_t chunk_len = 64 - bufsize;
        memcpy(hash->buf + bufsize, data, chunk_len);
        data += chunk_len;
        len -= chunk_len;
        secp256k1_sha256_transform(hash->s, hash->buf);
        bufsize = 0;
    }
    if (len) {
        /* Fill the buffer with what remains. */
        memcpy(hash->buf + bufsize, data, len);
    }
}